

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fs.c
# Opt level: O2

int uv__fs_statx(int fd,char *path,int is_fstat,int is_lstat,uv_stat_t *buf)

{
  undefined1 auVar1 [16];
  int iVar2;
  int iVar3;
  uint *puVar4;
  uv__statx statxbuf;
  
  if (uv__fs_statx_no_statx == '\0') {
    if (is_fstat == 0) {
      fd = -100;
    }
    iVar2 = (uint)(is_fstat != 0) * 0x1000;
    iVar3 = iVar2 + 0x100;
    if (is_lstat == 0) {
      iVar3 = iVar2;
    }
    iVar3 = uv__statx(fd,path,iVar3,0xfff,&statxbuf);
    if (iVar3 == 0) {
      buf->st_dev = (ulong)(statxbuf.stx_dev_major * 0x100 + statxbuf.stx_dev_minor);
      buf->st_mode = (ulong)statxbuf.stx_mode;
      auVar1._8_4_ = statxbuf.stx_uid;
      auVar1._0_8_ = statxbuf._16_8_ & 0xffffffff;
      auVar1._12_4_ = 0;
      buf->st_nlink = statxbuf._16_8_ & 0xffffffff;
      buf->st_uid = auVar1._8_8_;
      buf->st_gid = (ulong)statxbuf.stx_gid;
      buf->st_rdev = (ulong)statxbuf.stx_rdev_major;
      buf->st_ino = statxbuf.stx_ino;
      buf->st_size = statxbuf.stx_size;
      buf->st_blksize = (ulong)statxbuf.stx_blksize;
      buf->st_blocks = statxbuf.stx_blocks;
      (buf->st_atim).tv_sec = statxbuf.stx_atime.tv_sec;
      (buf->st_atim).tv_nsec = (ulong)statxbuf.stx_atime.tv_nsec;
      (buf->st_mtim).tv_sec = statxbuf.stx_mtime.tv_sec;
      (buf->st_mtim).tv_nsec = (ulong)statxbuf.stx_mtime.tv_nsec;
      (buf->st_ctim).tv_sec = statxbuf.stx_ctime.tv_sec;
      (buf->st_ctim).tv_nsec = (ulong)statxbuf.stx_ctime.tv_nsec;
      (buf->st_birthtim).tv_sec = statxbuf.stx_btime.tv_sec;
      (buf->st_birthtim).tv_nsec = (ulong)statxbuf.stx_btime.tv_nsec;
      buf->st_flags = 0;
      buf->st_gen = 0;
      return 0;
    }
    if (iVar3 == -1) {
      puVar4 = (uint *)__errno_location();
      if (0x26 < (ulong)*puVar4) {
        return -1;
      }
      if ((0x4000400002U >> ((ulong)*puVar4 & 0x3f) & 1) == 0) {
        return -1;
      }
    }
    uv__fs_statx_no_statx = '\x01';
  }
  return -0x26;
}

Assistant:

static int uv__fs_statx(int fd,
                        const char* path,
                        int is_fstat,
                        int is_lstat,
                        uv_stat_t* buf) {
  STATIC_ASSERT(UV_ENOSYS != -1);
#ifdef __linux__
  static int no_statx;
  struct uv__statx statxbuf;
  int dirfd;
  int flags;
  int mode;
  int rc;

  if (no_statx)
    return UV_ENOSYS;

  dirfd = AT_FDCWD;
  flags = 0; /* AT_STATX_SYNC_AS_STAT */
  mode = 0xFFF; /* STATX_BASIC_STATS + STATX_BTIME */

  if (is_fstat) {
    dirfd = fd;
    flags |= 0x1000; /* AT_EMPTY_PATH */
  }

  if (is_lstat)
    flags |= AT_SYMLINK_NOFOLLOW;

  rc = uv__statx(dirfd, path, flags, mode, &statxbuf);

  switch (rc) {
  case 0:
    break;
  case -1:
    /* EPERM happens when a seccomp filter rejects the system call.
     * Has been observed with libseccomp < 2.3.3 and docker < 18.04.
     */
    if (errno != EINVAL && errno != EPERM && errno != ENOSYS)
      return -1;
    /* Fall through. */
  default:
    /* Normally on success, zero is returned and On error, -1 is returned.
     * Observed on S390 RHEL running in a docker container with statx not
     * implemented, rc might return 1 with 0 set as the error code in which
     * case we return ENOSYS.
     */
    no_statx = 1;
    return UV_ENOSYS;
  }

  buf->st_dev = 256 * statxbuf.stx_dev_major + statxbuf.stx_dev_minor;
  buf->st_mode = statxbuf.stx_mode;
  buf->st_nlink = statxbuf.stx_nlink;
  buf->st_uid = statxbuf.stx_uid;
  buf->st_gid = statxbuf.stx_gid;
  buf->st_rdev = statxbuf.stx_rdev_major;
  buf->st_ino = statxbuf.stx_ino;
  buf->st_size = statxbuf.stx_size;
  buf->st_blksize = statxbuf.stx_blksize;
  buf->st_blocks = statxbuf.stx_blocks;
  buf->st_atim.tv_sec = statxbuf.stx_atime.tv_sec;
  buf->st_atim.tv_nsec = statxbuf.stx_atime.tv_nsec;
  buf->st_mtim.tv_sec = statxbuf.stx_mtime.tv_sec;
  buf->st_mtim.tv_nsec = statxbuf.stx_mtime.tv_nsec;
  buf->st_ctim.tv_sec = statxbuf.stx_ctime.tv_sec;
  buf->st_ctim.tv_nsec = statxbuf.stx_ctime.tv_nsec;
  buf->st_birthtim.tv_sec = statxbuf.stx_btime.tv_sec;
  buf->st_birthtim.tv_nsec = statxbuf.stx_btime.tv_nsec;
  buf->st_flags = 0;
  buf->st_gen = 0;

  return 0;
#else
  return UV_ENOSYS;
#endif /* __linux__ */
}